

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameIdenticalPayoff.cpp
# Opt level: O2

string * __thiscall
BayesianGameIdenticalPayoff::SoftPrintUtilForJointType_abi_cxx11_
          (string *__return_storage_ptr__,BayesianGameIdenticalPayoff *this,Index jtype)

{
  ostream *poVar1;
  uint uVar2;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  stringstream ss;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  poVar1 = std::operator<<(local_1a8,"Utility function for jtype ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,"with prob.=");
  (*(this->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
    super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
    _vptr_Interface_ProblemToPolicyDiscrete[0xd])(this,(ulong)jtype);
  poVar1 = std::ostream::_M_insert<double>(extraout_XMM0_Qa);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(local_1a8,"jtype\tja\tu(jtype,ja)");
  std::endl<char,std::char_traits<char>>(poVar1);
  for (uVar2 = 0;
      (ulong)uVar2 <
      (this->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase._m_nrJA;
      uVar2 = uVar2 + 1) {
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    poVar1 = std::operator<<(poVar1,"\t");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(poVar1,"\t");
    (*(this->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
      super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
      _vptr_Interface_ProblemToPolicyDiscrete[0x10])(this,(ulong)jtype,(ulong)uVar2);
    poVar1 = std::ostream::_M_insert<double>(extraout_XMM0_Qa_00);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

string BayesianGameIdenticalPayoff::SoftPrintUtilForJointType(Index jtype) const
{
    stringstream ss;
    ss << "Utility function for jtype "<<jtype << 
        "with prob.="<< GetProbability(jtype) << endl;
    ss << "jtype\tja\tu(jtype,ja)"<<endl;
    for(Index jaI=0; jaI < _m_nrJA; jaI++)
        ss << jtype << "\t" << jaI << "\t" << GetUtility(jtype, jaI)<<endl;
    return(ss.str());
}